

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# block.cc
# Opt level: O3

Iterator * __thiscall leveldb::Block::NewIterator(Block *this,Comparator *comparator)

{
  int iVar1;
  uint32_t uVar2;
  CleanupFunction p_Var3;
  Iterator *pIVar4;
  Status local_50;
  Slice local_48;
  Slice local_38;
  
  if (this->size_ < 4) {
    local_38.data_ = "bad block contents";
    local_38.size_ = 0x12;
    local_48.data_ = "";
    local_48.size_ = 0;
    Status::Status(&local_50,kCorruption,&local_38,&local_48);
    pIVar4 = NewErrorIterator(&local_50);
    if (local_50.state_ != (char *)0x0) {
      operator_delete__(local_50.state_);
    }
  }
  else {
    p_Var3 = (CleanupFunction)this->data_;
    iVar1 = *(int *)(p_Var3 + (this->size_ - 4));
    if (iVar1 == 0) {
      pIVar4 = NewEmptyIterator();
      return pIVar4;
    }
    pIVar4 = (Iterator *)operator_new(0x80);
    uVar2 = this->restart_offset_;
    Iterator::Iterator(pIVar4);
    pIVar4->_vptr_Iterator = (_func_int **)&PTR__Iter_00131d28;
    pIVar4[1]._vptr_Iterator = (_func_int **)comparator;
    pIVar4[1].cleanup_head_.function = p_Var3;
    *(uint32_t *)&pIVar4[1].cleanup_head_.arg1 = uVar2;
    *(int *)((long)&pIVar4[1].cleanup_head_.arg1 + 4) = iVar1;
    *(uint32_t *)&pIVar4[1].cleanup_head_.arg2 = uVar2;
    *(int *)((long)&pIVar4[1].cleanup_head_.arg2 + 4) = iVar1;
    pIVar4[1].cleanup_head_.next = &pIVar4[2].cleanup_head_;
    pIVar4[2]._vptr_Iterator = (_func_int **)0x0;
    *(undefined1 *)&pIVar4[2].cleanup_head_.function = 0;
    pIVar4[2].cleanup_head_.arg2 = "";
    pIVar4[2].cleanup_head_.next = (CleanupNode *)0x0;
    pIVar4[3]._vptr_Iterator = (_func_int **)0x0;
  }
  return pIVar4;
}

Assistant:

Iterator* Block::NewIterator(const Comparator* comparator) {
  if (size_ < sizeof(uint32_t)) {
    return NewErrorIterator(Status::Corruption("bad block contents"));
  }
  const uint32_t num_restarts = NumRestarts();
  if (num_restarts == 0) {
    return NewEmptyIterator();
  } else {
    return new Iter(comparator, data_, restart_offset_, num_restarts);
  }
}